

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O2

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
          (Zp_field_operators<unsigned_int,_void> *this,Characteristic characteristic)

{
  this->characteristic_ = 0;
  (this->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (characteristic != 0) {
    set_characteristic(this,characteristic);
  }
  return;
}

Assistant:

Zp_field_operators(Characteristic characteristic = 0) : characteristic_(0) {
    if (characteristic != 0) set_characteristic(characteristic);
  }